

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

double __thiscall Json::Value::asDouble(Value *this)

{
  LargestInt LVar1;
  undefined1 auVar2 [16];
  Value *local_1d8;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream oss;
  Value *this_local;
  
  switch(this->field_0x8) {
  case 0:
    this_local = (Value *)0x0;
    break;
  case 1:
    this_local = (Value *)(double)(this->value_).int_;
    break;
  case 2:
    LVar1 = (this->value_).int_;
    auVar2._8_4_ = (int)((ulong)LVar1 >> 0x20);
    auVar2._0_8_ = LVar1;
    auVar2._12_4_ = 0x45300000;
    this_local = (Value *)((auVar2._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)LVar1) - 4503599627370496.0));
    break;
  case 3:
    this_local = (Value *)(this->value_).map_;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::operator<<((ostream *)local_190,"Value is not convertible to double.");
    std::__cxx11::ostringstream::str();
    throwLogicError(&local_1c0);
  case 5:
    local_1d8 = (Value *)0x3ff0000000000000;
    if (((this->value_).bool_ & 1U) == 0) {
      local_1d8 = (Value *)0x0;
    }
    this_local = local_1d8;
  }
  return (double)this_local;
}

Assistant:

double Value::asDouble() const {
  switch (type_) {
  case intValue:
    return static_cast<double>(value_.int_);
  case uintValue:
#if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return static_cast<double>(value_.uint_);
#else  // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
    return integerToDouble(value_.uint_);
#endif // if !defined(JSON_USE_INT64_DOUBLE_CONVERSION)
  case realValue:
    return value_.real_;
  case nullValue:
    return 0.0;
  case booleanValue:
    return value_.bool_ ? 1.0 : 0.0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to double.");
}